

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.h
# Opt level: O1

void __thiscall
cppcms::session_interface::set<char[3]>(session_interface *this,string *key,char (*value) [3])

{
  size_t sVar1;
  ostringstream ss;
  locale local_1c0 [8];
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::locale::classic();
  std::ios::imbue(local_1c0);
  std::locale::~locale(local_1c0);
  sVar1 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,*value,sVar1);
  std::__cxx11::stringbuf::str();
  cppcms::session_interface::set((string *)this,(string *)key);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void set(std::string const &key,T const &value)
	{
		std::ostringstream ss;
		ss.imbue(std::locale::classic());
		ss<<value;
		set(key,ss.str());
	}